

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Malloc(u64 n)

{
  void *local_18;
  void *p;
  u64 n_local;
  
  if ((n == 0) || (0x7ffffeff < n)) {
    local_18 = (void *)0x0;
  }
  else {
    p = (void *)n;
    if (sqlite3Config.bMemstat == 0) {
      local_18 = (*sqlite3Config.m.xMalloc)((int)n);
    }
    else {
      sqlite3_mutex_enter(mem0.mutex);
      mallocWithAlarm((int)p,&local_18);
      sqlite3_mutex_leave(mem0.mutex);
    }
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Malloc(u64 n){
  void *p;
  if( n==0 || n>SQLITE_MAX_ALLOCATION_SIZE ){
    p = 0;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    mallocWithAlarm((int)n, &p);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    p = sqlite3GlobalConfig.m.xMalloc((int)n);
  }
  assert( EIGHT_BYTE_ALIGNMENT(p) );  /* IMP: R-11148-40995 */
  return p;
}